

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QSet<QGesture_*> QSet<QGesture_*>::intersected_helper(QSet<QGesture_*> *lhs,QSet<QGesture_*> *rhs)

{
  bool bVar1;
  QSet<QGesture_*> *this;
  QGesture **in_RDX;
  Hash in_RDI;
  long in_FS_OFFSET;
  QGesture **e_1;
  QSet<QGesture_*> *__range2_1;
  QGesture **e;
  QSet<QGesture_*> *__range2;
  QSet<QGesture_*> *r;
  const_iterator it;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  const_iterator __end0;
  const_iterator __begin0;
  qsizetype r_size;
  qsizetype l_size;
  Data *this_00;
  QGesture **in_stack_ffffffffffffff30;
  QSet<QGesture_*> *in_stack_ffffffffffffff38;
  qsizetype local_18;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI.d;
  QSet((QSet<QGesture_*> *)0x32411b);
  local_10 = size((QSet<QGesture_*> *)0x324125);
  local_18 = size((QSet<QGesture_*> *)0x324137);
  std::min<long_long>(&local_10,&local_18);
  reserve((QSet<QGesture_*> *)this_00,(qsizetype)in_RDI.d);
  if (local_18 < local_10) {
    begin(in_stack_ffffffffffffff38);
    end(in_stack_ffffffffffffff38);
    while (bVar1 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI.d),
          bVar1) {
      const_iterator::operator*((const_iterator *)0x324321);
      find(in_stack_ffffffffffffff38,in_RDX);
      end(in_stack_ffffffffffffff38);
      bVar1 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI.d);
      if (bVar1) {
        const_iterator::operator*((const_iterator *)0x324380);
        insert(in_stack_ffffffffffffff38,in_RDX);
      }
      const_iterator::operator++((const_iterator *)this_00);
    }
  }
  else {
    begin(in_stack_ffffffffffffff38);
    end(in_stack_ffffffffffffff38);
    while (bVar1 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI.d),
          bVar1) {
      this = (QSet<QGesture_*> *)const_iterator::operator*((const_iterator *)0x324227);
      bVar1 = contains((QSet<QGesture_*> *)this_00,(QGesture **)in_RDI.d);
      if (bVar1) {
        insert(this,in_stack_ffffffffffffff30);
      }
      const_iterator::operator++((const_iterator *)this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QSet<QGesture_*>)(Hash)in_RDI.d;
  }
  __stack_chk_fail();
}

Assistant:

auto QSet<T>::intersected_helper(const QSet &lhs, const QSet &rhs) -> QSet
{
    QSet r;

    const auto l_size = lhs.size();
    const auto r_size = rhs.size();
    r.reserve((std::min)(l_size, r_size));

    // Iterate the smaller of the two sets, but always take from lhs, for
    // consistency with insert():

    if (l_size <= r_size) {
        // lhs is not larger
        for (const auto &e : lhs) {
            if (rhs.contains(e))
                r.insert(e);
        }
    } else {
        // rhs is smaller
        for (const auto &e : rhs) {
            if (const auto it = lhs.find(e); it != lhs.end())
                r.insert(*it);
        }
    }

    return r;
}